

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcmStreamReader.cpp
# Opt level: O3

uint8_t * LPCMStreamReader::findSubstr(char *pattern,uint8_t *buff,uint8_t *end)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  size_t sVar3;
  size_t sVar4;
  uint8_t *curPos;
  
  sVar3 = strlen(pattern);
  if (buff < end + -sVar3) {
    do {
      if ((sVar3 != 0) && (*buff == *pattern)) {
        sVar4 = 1;
        do {
          if (sVar3 == sVar4) {
            return buff;
          }
          puVar1 = buff + sVar4;
          puVar2 = (uint8_t *)(pattern + sVar4);
          sVar4 = sVar4 + 1;
        } while (*puVar1 == *puVar2);
      }
      buff = buff + 1;
    } while (buff < end + -sVar3);
  }
  return (uint8_t *)0x0;
}

Assistant:

uint8_t* LPCMStreamReader::findSubstr(const char* pattern, uint8_t* buff, const uint8_t* end)
{
    const size_t patternLen = strlen(pattern);
    for (uint8_t* curPos = buff; curPos < end - patternLen; curPos++)
    {
        for (size_t j = 0; j < patternLen; j++)
        {
            if (curPos[j] != static_cast<uint8_t>(pattern[j]))
                break;
            if (j == patternLen - 1)
                return curPos;
        }
    }
    return nullptr;
}